

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testWriteDouble(DataFileTest *this)

{
  long *plVar1;
  int iVar2;
  DataFileWriter<Complex<double>_> df;
  auto_ptr<avro::DataFileWriterBase> local_28;
  double local_20;
  double local_18;
  
  avro::DataFileWriter<Complex<double>_>::DataFileWriter
            ((DataFileWriter<Complex<double>_> *)&local_28,this->filename,&this->writerSchema,100,
             NULL_CODEC);
  local_18 = 3.0;
  local_20 = 5.0;
  iVar2 = 1000;
  do {
    avro::DataFileWriterBase::syncIfNeeded();
    plVar1 = *(long **)(local_28._M_ptr + 0x30);
    (**(code **)(*plVar1 + 0x48))(local_18,plVar1);
    (**(code **)(*plVar1 + 0x48))(local_20,plVar1);
    *(long *)(local_28._M_ptr + 0x70) = *(long *)(local_28._M_ptr + 0x70) + 1;
    local_18 = local_18 + local_20 + -0.7;
    local_20 = local_20 + 3.1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  avro::DataFileWriterBase::close();
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&local_28);
  return;
}

Assistant:

void testWriteDouble() {
        avro::DataFileWriter<ComplexDouble> df(filename, writerSchema, 100);
        double re = 3.0;
        double im = 5.0;
        for (int i = 0; i < count; ++i, re += im - 0.7, im += 3.1) {
            ComplexDouble c(re, im);
            df.write(c);
        }
        df.close();
    }